

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

Of_Man_t * Of_StoCreate(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  int iVar1;
  Vec_Int_t *vRefs;
  int *piVar2;
  Of_Man_t *p_00;
  abctime aVar3;
  Of_Obj_t *pOVar4;
  Vec_Mem_t *pVVar5;
  int *pRefs;
  Vec_Int_t *vFlowRefs;
  Of_Man_t *p;
  Jf_Par_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  if ((pPars->nCutNum < 2) || (0x20 < pPars->nCutNum)) {
    __assert_fail("pPars->nCutNum > 1 && pPars->nCutNum <= OF_CUT_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                  ,0xd3,"Of_Man_t *Of_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  if ((1 < pPars->nLutSize) && (pPars->nLutSize < 7)) {
    if (pGia->pRefs != (int *)0x0) {
      free(pGia->pRefs);
      pGia->pRefs = (int *)0x0;
    }
    Vec_IntFreeP(&pGia->vCellMapping);
    iVar1 = Gia_ManHasChoices(pGia);
    if (iVar1 != 0) {
      Gia_ManSetPhase(pGia);
    }
    if (pGia->pRefs != (int *)0x0) {
      free(pGia->pRefs);
      pGia->pRefs = (int *)0x0;
    }
    vRefs = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs(pGia,vRefs);
    piVar2 = Vec_IntReleaseArray(vRefs);
    pGia->pRefs = piVar2;
    Vec_IntFree(vRefs);
    p_00 = (Of_Man_t *)calloc(1,0xb0);
    aVar3 = Abc_Clock();
    p_00->clkStart = aVar3;
    p_00->pGia = pGia;
    p_00->pPars = pPars;
    iVar1 = Gia_ManObjNum(pGia);
    pOVar4 = (Of_Obj_t *)calloc((long)iVar1,0x20);
    p_00->pObjs = pOVar4;
    p_00->iCur = 2;
    Vec_PtrGrow(&p_00->vPages,0x100);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_IntFill(&p_00->vCutSets,iVar1,0);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_IntFill(&p_00->vCutFlows,iVar1,0);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_IntFill(&p_00->vCutDelays,iVar1,0);
    Vec_IntGrow(&p_00->vCutRefs,1000);
    if (pPars->fCutMin != 0) {
      pVVar5 = Vec_MemAllocForTT(6,0);
      p_00->vTtMem = pVVar5;
    }
    piVar2 = pGia->pRefs;
    pGia->pRefs = (int *)0x0;
    Of_ManAreaFlow(p_00);
    pGia->pRefs = piVar2;
    return p_00;
  }
  __assert_fail("pPars->nLutSize > 1 && pPars->nLutSize <= OF_LEAF_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                ,0xd4,"Of_Man_t *Of_StoCreate(Gia_Man_t *, Jf_Par_t *)");
}

Assistant:

Of_Man_t * Of_StoCreate( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    extern void Mf_ManSetFlowRefs( Gia_Man_t * p, Vec_Int_t * vRefs );
    Of_Man_t * p;
    Vec_Int_t * vFlowRefs;
    int * pRefs = NULL;
    assert( pPars->nCutNum > 1  && pPars->nCutNum <= OF_CUT_MAX );
    assert( pPars->nLutSize > 1 && pPars->nLutSize <= OF_LEAF_MAX );
    ABC_FREE( pGia->pRefs );
    Vec_IntFreeP( &pGia->vCellMapping );
    if ( Gia_ManHasChoices(pGia) )
        Gia_ManSetPhase(pGia);
    // create references
    ABC_FREE( pGia->pRefs );
    vFlowRefs = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs( pGia, vFlowRefs );
    pGia->pRefs= Vec_IntReleaseArray(vFlowRefs);
    Vec_IntFree(vFlowRefs);
    // create
    p = ABC_CALLOC( Of_Man_t, 1 );
    p->clkStart = Abc_Clock();
    p->pGia     = pGia;
    p->pPars    = pPars;
    p->pObjs    = ABC_CALLOC( Of_Obj_t, Gia_ManObjNum(pGia) );
    p->iCur     = 2;
    // other
    Vec_PtrGrow( &p->vPages, 256 );                                    // cut memory
    Vec_IntFill( &p->vCutSets,  Gia_ManObjNum(pGia), 0 );              // cut offsets
    Vec_IntFill( &p->vCutFlows, Gia_ManObjNum(pGia), 0 );              // cut area
    Vec_IntFill( &p->vCutDelays,Gia_ManObjNum(pGia), 0 );              // cut delay
    Vec_IntGrow( &p->vCutRefs,  1000 );                                // cut references
    if ( pPars->fCutMin )
        p->vTtMem = Vec_MemAllocForTT( 6, 0 );          
    // compute area flow
    pRefs = pGia->pRefs; pGia->pRefs = NULL;
    Of_ManAreaFlow( p );
    pGia->pRefs = pRefs;
    return p;
}